

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user.c
# Opt level: O0

int linux_evfilt_user_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  uint evfd;
  uint uVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  uint fflags;
  uint ffctrl;
  
  evfd = *(uint *)(in_RDX + 0xc) & 0xc0000000;
  uVar1 = *(uint *)(in_RDX + 0xc) & 0xffffff;
  if (evfd == 0xc0000000) {
    *(uint *)(in_RSI + 0xc) = uVar1;
  }
  else if ((evfd != 0) && (evfd == 0x40000000)) {
    *(uint *)(in_RSI + 0xc) = uVar1 & *(uint *)(in_RSI + 0xc);
  }
  if (((*(ushort *)(in_RSI + 10) & 8) == 0) && ((*(uint *)(in_RDX + 0xc) & 0x1000000) != 0)) {
    *(uint *)(in_RSI + 0xc) = *(uint *)(in_RSI + 0xc) | 0x1000000;
    iVar2 = eventfd_raise(evfd);
    if (iVar2 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int
linux_evfilt_user_knote_modify(struct filter *filt UNUSED, struct knote *kn, const struct kevent *kev)
{
    unsigned int ffctrl;
    unsigned int fflags;

    /* Excerpted from sys/kern/kern_event.c in FreeBSD HEAD */
    ffctrl = kev->fflags & NOTE_FFCTRLMASK;
    fflags = kev->fflags & NOTE_FFLAGSMASK;
    switch (ffctrl) {
        case NOTE_FFNOP:
            break;

        case NOTE_FFAND:
            kn->kev.fflags &= fflags;
            break;

        case NOTE_FFOR:
            kn->kev.fflags |= fflags;
            break;

        case NOTE_FFCOPY:
            kn->kev.fflags = fflags;
            break;

        default:
            /* XXX Return error? */
            break;
    }

    if ((!(kn->kev.flags & EV_DISABLE)) && kev->fflags & NOTE_TRIGGER) {
        kn->kev.fflags |= NOTE_TRIGGER;
        if (eventfd_raise(kn->kn_eventfd) < 0)
            return (-1);
    }

    return (0);
}